

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>_>
::matches(Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>_>
          *this,candidate_t<wasm::Const_*> candidate)

{
  bool bVar1;
  bool local_39;
  MatchSelf<wasm::Const_*> local_29;
  matched_t<wasm::Const_*> local_28;
  matched_t<wasm::Const_*> casted;
  candidate_t<wasm::Const_*> candidate_local;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>_>
  *this_local;
  
  casted = (matched_t<wasm::Const_*>)candidate;
  candidate_local = (candidate_t<wasm::Const_*>)this;
  bVar1 = dynCastCandidate<wasm::Const_*,_0>(candidate,&local_28);
  if (bVar1) {
    if (this->binder != (matched_t<wasm::Const_*> *)0x0) {
      *this->binder = local_28;
    }
    bVar1 = MatchSelf<wasm::Const_*>::operator()(&local_29,local_28);
    local_39 = false;
    if (bVar1) {
      local_39 = Components<wasm::Const_*,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>_>
                 ::match(local_28,&this->submatchers);
    }
    this_local._7_1_ = local_39;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }